

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_matrix.c
# Opt level: O0

void SUNMatFreeEmpty(SUNMatrix A)

{
  void *in_RDI;
  
  if (in_RDI != (void *)0x0) {
    if (*(long *)((long)in_RDI + 8) != 0) {
      free(*(void **)((long)in_RDI + 8));
    }
    *(undefined8 *)((long)in_RDI + 8) = 0;
    free(in_RDI);
  }
  return;
}

Assistant:

void SUNMatFreeEmpty(SUNMatrix A)
{
  if (A == NULL)  return;

  /* free non-NULL ops structure */
  if (A->ops)  free(A->ops);
  A->ops = NULL;

  /* free overall SUNMatrix object and return */
  free(A);
  return;
}